

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

int disp_artifact_discoveries(menulist *menu)

{
  short sVar1;
  int artinum;
  nh_menuitem *pnVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  char buf [256];
  int otyp;
  int m;
  int i;
  menulist *menu_local;
  
  for (otyp = 0; (otyp < 0x24 && (artidisco[otyp] != '\0')); otyp = otyp + 1) {
    if (otyp == 0) {
      if (menu->size <= menu->icount) {
        menu->size = menu->size << 1;
        pnVar2 = (nh_menuitem *)realloc(menu->items,(long)menu->size * 0x10c);
        menu->items = pnVar2;
      }
      pnVar2 = menu->items + menu->icount;
      pnVar2->id = 0;
      pnVar2->role = MI_HEADING;
      pnVar2->accel = '\0';
      pnVar2->group_accel = '\0';
      pnVar2->selected = '\0';
      strcpy(pnVar2->caption,"Artifacts");
      menu->icount = menu->icount + 1;
    }
    artinum = (int)artidisco[otyp];
    sVar1 = artilist[artinum].otyp;
    pcVar3 = artiname(artinum);
    pcVar4 = align_str(artilist[artinum].alignment);
    pcVar5 = simple_typename((int)sVar1);
    sprintf((char *)&_item_,"  %s [%s %s]",pcVar3,pcVar4,pcVar5);
    if (menu->size <= menu->icount) {
      menu->size = menu->size << 1;
      pnVar2 = (nh_menuitem *)realloc(menu->items,(long)menu->size * 0x10c);
      menu->items = pnVar2;
    }
    pnVar2 = menu->items + menu->icount;
    pnVar2->id = 0;
    pnVar2->role = MI_TEXT;
    pnVar2->accel = '\0';
    pnVar2->group_accel = '\0';
    pnVar2->selected = '\0';
    strcpy(pnVar2->caption,(char *)&_item_);
    menu->icount = menu->icount + 1;
  }
  return otyp;
}

Assistant:

int disp_artifact_discoveries(
    struct menulist *menu /* supplied by dodiscover() */
    )
{
    int i, m, otyp;
    char buf[BUFSZ];

    for (i = 0; i < NROFARTIFACTS; i++) {
	if (artidisco[i] == 0) break;	/* empty slot implies end of list */
	if (i == 0)
	    add_menuheading(menu, "Artifacts");
	m = artidisco[i];
	otyp = artilist[m].otyp;
	sprintf(buf, "  %s [%s %s]", artiname(m),
		align_str(artilist[m].alignment), simple_typename(otyp));
	add_menutext(menu, buf);
    }
    return i;
}